

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall
LexerTest_LexLineComment_Test::~LexerTest_LexLineComment_Test(LexerTest_LexLineComment_Test *this)

{
  LexerTest_LexLineComment_Test *this_local;
  
  ~LexerTest_LexLineComment_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexLineComment) {
  Lexer lexer("1;; whee! 2 3\t4\r5\n6"sv);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{1, 0}));
  EXPECT_EQ(lexer.takeI32(), 1);

  ASSERT_FALSE(lexer.empty());
  EXPECT_EQ(lexer.position(), (TextPos{2, 0}));
  EXPECT_EQ(lexer.takeI32(), 6);

  EXPECT_TRUE(lexer.empty());
}